

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall singleParticleSpectra::output_two_particle_correlation(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  reference pvVar5;
  void *pvVar6;
  string *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double Qn2_os_err;
  double Cn2_os_stdsq;
  double Cn2_os_avg;
  double Qn2_ss_err;
  double Cn2_ss_stdsq;
  double Cn2_ss_avg;
  double vn2_err_1;
  double vn2_avg_1;
  int i_1;
  double num_pair_os_err;
  double num_pair_os_stdsq;
  double num_pair_os;
  double num_pair_ss_err;
  double num_pair_ss_stdsq;
  double num_pair_ss;
  ofstream output_os;
  ofstream output_ss;
  ostringstream filename_os;
  ostringstream filename_ss;
  double Qn2_err;
  double Qn2_stdsq;
  double Qn2_avg;
  double vn2_err;
  double vn2_avg;
  int i;
  double num_pair_err;
  double num_pair_stdsq;
  double num_pair;
  ofstream output;
  ostringstream filename;
  double local_b90;
  double local_b88;
  int local_b7c;
  double local_b70;
  double local_b50;
  string local_b38 [32];
  ostream local_b18 [512];
  string local_918 [32];
  ostream local_8f8 [512];
  ostringstream local_6f8 [376];
  ostringstream local_580 [376];
  int local_408;
  int local_404;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  string local_3b0 [32];
  ostream local_390 [528];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  if (*(int *)(in_RDI + 0x238) == 0) {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_vn2");
    poVar3 = std::operator<<(poVar3,"_eta_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_vn2");
    poVar3 = std::operator<<(poVar3,"_y_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_390,pcVar4,_S_out);
  std::__cxx11::string::~string(local_3b0);
  poVar3 = std::operator<<(local_390,"# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 1000),0);
  local_3b8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),0);
  local_3c0 = -local_3b8 * local_3b8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  local_3c8 = 0.0;
  if (0.0 < local_3c0) {
    local_3c8 = sqrt(local_3c0 / (double)*(int *)(in_RDI + 0x2f8));
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
  local_3cc = (int)std::setw(0x12);
  poVar3 = std::operator<<(poVar3,(_Setw)local_3cc);
  local_3d0 = (int)std::setprecision(8);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_3d0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3b8);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c8);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3b8);
  poVar3 = std::operator<<(poVar3,"  ");
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),0);
  pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  for (local_3d4 = 1; local_3d4 < *(int *)(in_RDI + 0x1c8); local_3d4 = local_3d4 + 1) {
    local_3e0 = 0.0;
    local_3e8 = 0.0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1000),(long)local_3d4);
    local_3f0 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    if (0.0 < local_3f0) {
      local_3e0 = sqrt(local_3f0 / local_3b8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),
                          (long)local_3d4);
      local_3f8 = -local_3f0 * local_3f0 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      if (0.0 < local_3f8) {
        local_400 = sqrt(local_3f8 / (double)*(int *)(in_RDI + 0x2f8));
        local_3e8 = local_400 / local_3b8;
      }
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
    local_404 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_404);
    local_408 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_408);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3e0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3e8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3f0);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),(long)local_3d4)
    ;
    pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (*(int *)(in_RDI + 0x5d0) == 1) {
    std::__cxx11::ostringstream::ostringstream(local_580);
    std::__cxx11::ostringstream::ostringstream(local_6f8);
    if (*(int *)(in_RDI + 0x238) == 0) {
      poVar3 = std::operator<<((ostream *)local_580,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cn2_ss");
      poVar3 = std::operator<<(poVar3,"_eta_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
      poVar3 = std::operator<<((ostream *)local_6f8,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cn2_os");
      poVar3 = std::operator<<(poVar3,"_eta_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    else {
      poVar3 = std::operator<<((ostream *)local_580,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cn2_ss");
      poVar3 = std::operator<<(poVar3,"_y_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
      poVar3 = std::operator<<((ostream *)local_6f8,in_RDI);
      poVar3 = std::operator<<(poVar3,"/particle_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
      poVar3 = std::operator<<(poVar3,"_Cn2_os");
      poVar3 = std::operator<<(poVar3,"_y_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
      std::operator<<(poVar3,".dat");
    }
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_8f8,pcVar4,_S_out);
    std::__cxx11::string::~string(local_918);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_b18,pcVar4,_S_out);
    std::__cxx11::string::~string(local_b38);
    poVar3 = std::operator<<(local_8f8,"# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_b18,"# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x478),0);
    dVar7 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x490),0);
    dVar8 = -dVar7 * dVar7 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_b50 = 0.0;
    if (0.0 < dVar8) {
      local_b50 = sqrt(dVar8 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_8f8,std::scientific);
    _Var1 = std::setw(0x12);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b50);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x490),0);
    pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),0);
    dVar8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c0),0);
    dVar9 = -dVar8 * dVar8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_b70 = 0.0;
    if (0.0 < dVar9) {
      local_b70 = sqrt(dVar9 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_b18,std::scientific);
    _Var1 = std::setw(0x12);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b70);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c0),0);
    pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    for (local_b7c = 1; local_b7c < *(int *)(in_RDI + 0x1c8); local_b7c = local_b7c + 1) {
      local_b88 = 0.0;
      local_b90 = 0.0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x478),
                          (long)local_b7c);
      dVar9 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      if (0.0 < dVar9) {
        local_b88 = sqrt(dVar9 / dVar7);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x490),
                            (long)local_b7c);
        dVar10 = -dVar9 * dVar9 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
        if (0.0 < dVar10) {
          local_b90 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
          local_b90 = local_b90 / dVar7;
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_8f8,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b7c);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b88);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b90);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x490),
                          (long)local_b7c);
      pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      local_b88 = 0.0;
      local_b90 = 0.0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),
                          (long)local_b7c);
      dVar9 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
      if (0.0 < dVar9) {
        local_b88 = sqrt(dVar9 / dVar8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c0),
                            (long)local_b7c);
        dVar10 = -dVar9 * dVar9 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
        if (0.0 < dVar10) {
          local_b90 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
          local_b90 = local_b90 / dVar8;
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_b18,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b7c);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b88);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b90);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,"  ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c0),
                          (long)local_b7c);
      pvVar6 = (void *)std::ostream::operator<<(poVar3,*pvVar5 / (double)*(int *)(in_RDI + 0x2f8));
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(local_b18);
    std::ofstream::~ofstream(local_8f8);
    std::__cxx11::ostringstream::~ostringstream(local_6f8);
    std::__cxx11::ostringstream::~ostringstream(local_580);
  }
  std::ofstream::~ofstream(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>" << endl;

    double num_pair = Qn2_vector[0] / total_number_of_events;
    double num_pair_stdsq =
        (Qn2_vector_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << "  " << num_pair << "  "
           << Qn2_vector_err[0] / total_number_of_events << endl;
    for (int i = 1; i < order_max; i++) {
        double vn2_avg = 0.0;
        double vn2_err = 0.0;
        double Qn2_avg = Qn2_vector[i] / total_number_of_events;
        if (Qn2_avg > 0.) {
            vn2_avg = sqrt(Qn2_avg / num_pair);
            double Qn2_stdsq =
                (Qn2_vector_err[i] / total_number_of_events
                 - Qn2_avg * Qn2_avg);
            if (Qn2_stdsq > 0) {
                double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                vn2_err = Qn2_err / num_pair;
            }
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << vn2_avg << "  " << vn2_err << "  " << Qn2_avg << "  "
               << Qn2_vector_err[i] / total_number_of_events << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        output_ss << "# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err" << endl;
        output_os << "# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err" << endl;

        double num_pair_ss = Cn2_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (Cn2_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss << "  "
                  << Cn2_ss_err[0] / total_number_of_events << endl;
        double num_pair_os = Cn2_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (Cn2_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os << "  "
                  << Cn2_os_err[0] / total_number_of_events << endl;

        for (int i = 1; i < order_max; i++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Cn2_ss_avg = Cn2_ss[i] / total_number_of_events;
            if (Cn2_ss_avg > 0.) {
                vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                double Cn2_ss_stdsq =
                    (Cn2_ss_err[i] / total_number_of_events
                     - Cn2_ss_avg * Cn2_ss_avg);
                if (Cn2_ss_stdsq > 0) {
                    double Qn2_ss_err =
                        sqrt(Cn2_ss_stdsq / total_number_of_events);
                    vn2_err = Qn2_ss_err / num_pair_ss;
                }
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                      << "  " << Cn2_ss_err[i] / total_number_of_events << endl;

            vn2_avg = 0.0;
            vn2_err = 0.0;
            double Cn2_os_avg = Cn2_os[i] / total_number_of_events;
            if (Cn2_os_avg > 0.) {
                vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                double Cn2_os_stdsq =
                    (Cn2_os_err[i] / total_number_of_events
                     - Cn2_os_avg * Cn2_os_avg);
                if (Cn2_os_stdsq > 0) {
                    double Qn2_os_err =
                        sqrt(Cn2_os_stdsq / total_number_of_events);
                    vn2_err = Qn2_os_err / num_pair_os;
                }
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                      << "  " << Cn2_os_err[i] / total_number_of_events << endl;
        }
        output_ss.close();
        output_os.close();
    }
}